

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O1

int __thiscall
OpenMD::FreqFlucCorrFunc::computeProperty1(FreqFlucCorrFunc *this,int frame,StuntDouble *sd)

{
  double *pdVar1;
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  pointer pvVar2;
  bool bVar3;
  uint i;
  long lVar4;
  double tmp;
  Vector3d u;
  RealType uedot;
  double local_a8 [4];
  double local_88 [4];
  RotMat3x3d local_68;
  
  lVar4 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).electricField.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
  local_88[2] = *(double *)(lVar4 + 0x10 + (long)sd->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar4 + (long)sd->localIndex_ * 0x18);
  local_88[0] = *pdVar1;
  local_88[1] = pdVar1[1];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  if (sd->objType_ == otRigidBody) {
    StuntDouble::getA(&local_68,sd);
    local_a8[2] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [2];
  }
  else {
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)sd[1]._vptr_StuntDouble;
    bVar3 = MultipoleAdapter::isDipole((MultipoleAdapter *)&local_68);
    if (!bVar3) goto LAB_00137499;
    lVar4 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).dipole.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    local_a8[2] = *(double *)(lVar4 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar4 + (long)sd->localIndex_ * 0x18);
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = *pdVar1;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = pdVar1[1];
  }
  local_a8[0] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  local_a8[1] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1];
LAB_00137499:
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  lVar4 = 0;
  do {
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
         local_a8[lVar4] * local_88[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  Utils::Accumulator<double>::add(&this->ueStats_,(double *)&local_68);
  this_00 = (vector<double,std::allocator<double>> *)
            ((this->ue_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame);
  __position._M_current = *(double **)(this_00 + 8);
  if (__position._M_current == *(double **)(this_00 + 0x10)) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              (this_00,__position,(double *)&local_68);
  }
  else {
    *__position._M_current =
         local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    *(double **)(this_00 + 8) = __position._M_current + 1;
  }
  pvVar2 = (this->ue_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)*(pointer *)
                              ((long)&pvVar2[frame].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + 8) -
                      *(long *)&pvVar2[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int FreqFlucCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d e = sd->getElectricField();
    Vector3d u;
    if (sd->isRigidBody()) {
      u = sd->getA().getRow(2);
    } else {
      AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
      MultipoleAdapter ma = MultipoleAdapter(at);

      if (ma.isDipole()) { u = sd->getDipole(); }
    }

    RealType uedot = dot(u, e);
    ueStats_.add(uedot);

    ue_[frame].push_back(uedot);
    return ue_[frame].size() - 1;
  }